

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O2

void brotli::HistogramReindex<brotli::Histogram<704>>
               (vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *symbols)

{
  iterator iVar1;
  mapped_type_conflict *pmVar2;
  long lVar3;
  pointer puVar4;
  size_t i;
  ulong uVar5;
  size_type __new_size;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> tmp;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  new_index;
  _Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> local_78;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::vector
            ((vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)&local_78,
             out);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar3 = 0;
  __new_size = 0;
  uVar5 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    puVar4 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <= uVar5)
    break;
    iVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::find(&local_60,(key_type_conflict *)((long)puVar4 + lVar3));
    if ((_Rb_tree_header *)iVar1._M_node == &local_60._M_impl.super__Rb_tree_header) {
      pmVar2 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_60,
                            (key_type_conflict *)
                            ((long)(symbols->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar3));
      *pmVar2 = (mapped_type_conflict)__new_size;
      memcpy((out->
             super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
             _M_impl.super__Vector_impl_data._M_start + __new_size,
             local_78._M_impl.super__Vector_impl_data._M_start +
             *(uint *)((long)(symbols->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar3),0xb10);
      __new_size = (size_type)((mapped_type_conflict)__new_size + 1);
    }
    uVar5 = uVar5 + 1;
    lVar3 = lVar3 + 4;
  }
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
            (out,__new_size);
  puVar4 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(symbols->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar4 >> 2);
      uVar5 = uVar5 + 1) {
    pmVar2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)&local_60,(key_type_conflict *)((long)puVar4 + lVar3));
    puVar4 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(mapped_type_conflict *)((long)puVar4 + lVar3) = *pmVar2;
    lVar3 = lVar3 + 4;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  std::_Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::~_Vector_base
            (&local_78);
  return;
}

Assistant:

void HistogramReindex(std::vector<HistogramType>* out,
                      std::vector<uint32_t>* symbols) {
  std::vector<HistogramType> tmp(*out);
  std::map<uint32_t, uint32_t> new_index;
  uint32_t next_index = 0;
  for (size_t i = 0; i < symbols->size(); ++i) {
    if (new_index.find((*symbols)[i]) == new_index.end()) {
      new_index[(*symbols)[i]] = next_index;
      (*out)[next_index] = tmp[(*symbols)[i]];
      ++next_index;
    }
  }
  out->resize(next_index);
  for (size_t i = 0; i < symbols->size(); ++i) {
    (*symbols)[i] = new_index[(*symbols)[i]];
  }
}